

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::parse(Reader *this,istream *is,Value *root,bool collectComments)

{
  bool bVar1;
  char *beginDoc;
  long lVar2;
  long lVar3;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  allocator<char> local_69;
  undefined1 local_68 [12];
  undefined1 local_58 [12];
  string local_48 [8];
  String doc;
  bool collectComments_local;
  Value *root_local;
  istream *is_local;
  Reader *this_local;
  
  doc.field_2._M_local_buf[0xf] = collectComments;
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_58,is);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_68);
  std::allocator<char>::allocator();
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)local_58._0_8_;
  __beg._M_c = local_58._8_4_;
  __end._12_4_ = 0;
  __end._M_sbuf = (streambuf_type *)local_68._0_8_;
  __end._M_c = local_68._8_4_;
  std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            (local_48,__beg,__end,&local_69);
  std::allocator<char>::~allocator(&local_69);
  beginDoc = (char *)std::__cxx11::string::data();
  lVar2 = std::__cxx11::string::data();
  lVar3 = std::__cxx11::string::size();
  bVar1 = parse(this,beginDoc,(char *)(lVar2 + lVar3),root,(bool)(doc.field_2._M_local_buf[0xf] & 1)
               );
  std::__cxx11::string::~string(local_48);
  return bVar1;
}

Assistant:

bool Reader::parse(std::istream& is, Value& root, bool collectComments) {
  // std::istream_iterator<char> begin(is);
  // std::istream_iterator<char> end;
  // Those would allow streamed input from a file, if parse() were a
  // template function.

  // Since String is reference-counted, this at least does not
  // create an extra copy.
  String doc(std::istreambuf_iterator<char>(is), {});
  return parse(doc.data(), doc.data() + doc.size(), root, collectComments);
}